

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall tli_window_manager::TableBox::layout(TableBox *this)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  pointer pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int j;
  long lVar11;
  int i;
  long lVar12;
  vector<int,_std::allocator<int>_> col_sizes;
  vector<int,_std::allocator<int>_> row_sizes;
  allocator_type local_5d;
  value_type_conflict1 local_5c;
  _Vector_base<int,_std::allocator<int>_> local_58;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,(long)this->rows_,
             (value_type_conflict1 *)&local_58,(allocator_type *)&local_5c);
  local_5c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,(long)this->cols_,&local_5c,&local_5d);
  for (lVar12 = 0; uVar1 = this->rows_, lVar12 < (int)uVar1; lVar12 = lVar12 + 1) {
    lVar10 = 0;
    for (lVar11 = 0; lVar11 < this->cols_; lVar11 = lVar11 + 1) {
      puVar2 = *(undefined8 **)
                (*(long *)&(this->table_).
                           super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar12].
                           super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                           ._M_impl.super__Vector_impl_data + lVar10);
      if (puVar2 != (undefined8 *)0x0) {
        (**(code **)*puVar2)();
        lVar3 = *(long *)(*(long *)&(this->table_).
                                    super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                    super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar10);
        iVar8 = *(int *)(lVar3 + 0xc);
        if (iVar8 < local_40._M_impl.super__Vector_impl_data._M_start[lVar12]) {
          iVar8 = local_40._M_impl.super__Vector_impl_data._M_start[lVar12];
        }
        local_40._M_impl.super__Vector_impl_data._M_start[lVar12] = iVar8;
        iVar8 = *(int *)(lVar3 + 8);
        iVar9 = *(int *)(CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_58._M_impl.super__Vector_impl_data._M_start._0_4_) +
                        lVar11 * 4);
        if (iVar8 < iVar9) {
          iVar8 = iVar9;
        }
        *(int *)(CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_58._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar11 * 4) =
             iVar8;
      }
      lVar10 = lVar10 + 0x10;
    }
  }
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar6 = uVar7;
  }
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar7;
  }
  iVar8 = 0;
  iVar9 = 0;
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    pvVar4 = (this->table_).
             super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = 0;
    for (lVar12 = 0; uVar6 * 4 != lVar12; lVar12 = lVar12 + 4) {
      lVar10 = *(long *)&pvVar4[uVar7].
                         super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      if (*(long *)(lVar10 + lVar12 * 4) != 0) {
        *(int *)(lVar10 + 8 + lVar12 * 4) = iVar8;
        *(int *)(lVar10 + 0xc + lVar12 * 4) = iVar9;
      }
      iVar9 = iVar9 + *(int *)(CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_58._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              lVar12);
    }
    iVar8 = iVar8 + local_40._M_impl.super__Vector_impl_data._M_start[uVar7];
  }
  (this->super_Box).width_ = iVar9;
  (this->super_Box).height_ = iVar8;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void TableBox::layout() {
    std::vector<int> row_sizes(rows_, 0);
    std::vector<int> col_sizes(cols_, 0);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].first->layout();
                row_sizes[i] = std::max(row_sizes[i], table_[i][j].first->height());
                col_sizes[j] = std::max(col_sizes[j], table_[i][j].first->width());
            }
        }
    }

    int current_col = 0;
    int current_row = 0;
    for (int i = 0; i < rows_; ++i) {
        current_col = 0;
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].second = std::make_pair(current_row, current_col);
            }
            current_col += col_sizes[j];
        }
        current_row += row_sizes[i];
    }

//    for (int i = 0; i < rows_; ++i) {
//        for (int j = 0; j < cols_; ++j) {
//            std::cout << '(' << table_[i][j].second.first << ", " << table_[i][j].second.second << ") ";
//        }
//        std::cout << '\n';
//    }
//    std::cout << '\n';

    width_ = current_col;
    height_ = current_row;
}